

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_file_utilities.cpp
# Opt level: O0

bool ON_FileSystemPath::IsRelativePath(wchar_t *path,wchar_t directory_separator)

{
  wchar_t *pwStack_18;
  wchar_t directory_separator_local;
  wchar_t *path_local;
  
  if ((path != (wchar_t *)0x0) && (*path == L'.')) {
    pwStack_18 = path + 1;
    if (*pwStack_18 == L'.') {
      pwStack_18 = path + 2;
    }
    if (directory_separator == L'\0') {
      if (*pwStack_18 == L'/') {
        return true;
      }
      if (*pwStack_18 == L'\\') {
        return true;
      }
    }
    else if (directory_separator == *pwStack_18) {
      return true;
    }
  }
  return false;
}

Assistant:

bool ON_FileSystemPath::IsRelativePath(
  const wchar_t* path,
  const wchar_t directory_separator
  )
{
  for (;;)
  {
    if (nullptr == path)
      break;
    if ('.' != *path)
      break;
    path++;
    if ('.' == *path)
      path++;
    if (0 != directory_separator)
    {
      if (directory_separator != *path)
        break;
    }
    else
    {
      if (ON_FileSystemPath::DirectorySeparator != *path && ON_FileSystemPath::AlternateDirectorySeparator != *path)
        break;
    }

    return true;
  }
  return false;
}